

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayoutPrivate::distribute(QGridLayoutPrivate *this,QRect r,int hSpacing,int vSpacing)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QWidget *pQVar4;
  qsizetype qVar5;
  const_reference ppQVar6;
  QGridLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  QList<QLayoutStruct> *in_stack_00000018;
  int h;
  int w;
  int y2p;
  int x2p;
  int y;
  int x;
  int c2;
  int r2;
  QGridBox *box;
  int n;
  bool reverse;
  int i;
  QList<QLayoutStruct> *rData;
  QList<QLayoutStruct> *rDataPtr;
  QWidget *parent;
  bool visualHReversed;
  QGridLayout *q;
  int bottom;
  int right;
  int top;
  int left;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QGridBox *in_stack_fffffffffffffee0;
  QGridBox *this_00;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffefc;
  QGridLayoutPrivate *in_stack_ffffffffffffff00;
  int local_74;
  int local_28 [8];
  long lVar8;
  
  lVar8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar7 = (in_RDI->field_0x194 & 1) != 0;
  pQVar4 = QLayout::parentWidget
                     ((QLayout *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if ((pQVar4 != (QWidget *)0x0) && (bVar1 = QWidget::isRightToLeft((QWidget *)0x33432c), bVar1)) {
    bVar7 = !bVar7;
  }
  setupLayoutData((QGridLayoutPrivate *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                  (int)((ulong)lVar8 >> 0x20),(int)lVar8);
  local_28[3] = 0xaaaaaaaa;
  local_28[2] = 0xaaaaaaaa;
  local_28[1] = 0xaaaaaaaa;
  local_28[0] = -0x55555556;
  effectiveMargins(in_RDI,local_28 + 3,local_28 + 2,local_28 + 1,local_28);
  QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(int)in_stack_fffffffffffffee0);
  QRect::x((QRect *)0x33440c);
  QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  qGeomCalc(in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
            in_stack_00000008,unaff_retaddr_00);
  if (((byte)in_RDI->field_0x194 >> 3 & 1) == 0) {
    QRect::y((QRect *)0x334518);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    qGeomCalc(in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
              in_stack_00000008,unaff_retaddr_00);
  }
  else {
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    recalcHFW(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    QRect::y((QRect *)0x3344a9);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    qGeomCalc(in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
              in_stack_00000008,unaff_retaddr_00);
  }
  iVar2 = QRect::bottom((QRect *)0x334593);
  iVar3 = QRect::bottom((QRect *)0x3345a8);
  if (iVar2 <= iVar3) {
    iVar2 = QRect::bottom((QRect *)0x3345c9);
    iVar3 = QRect::bottom((QRect *)0x3345de);
    if (iVar2 == iVar3) {
      QRect::right((QRect *)0x3345fb);
      QRect::right((QRect *)0x334610);
    }
  }
  qVar5 = QList<QGridBox_*>::size(&in_RDI->things);
  for (local_74 = 0; local_74 < (int)qVar5; local_74 = local_74 + 1) {
    ppQVar6 = QList<QGridBox_*>::at
                        ((QList<QGridBox_*> *)in_stack_fffffffffffffee0,
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    this_00 = *ppQVar6;
    QGridBox::toRow(this_00,in_RDI->rr);
    QGridBox::toCol(this_00,in_RDI->cc);
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QList<QLayoutStruct>::at
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (bVar7) {
      QRect::left((QRect *)0x334834);
      QRect::right((QRect *)0x334845);
    }
    if (((byte)in_RDI->field_0x194 >> 1 & 1) != 0) {
      in_stack_fffffffffffffeec = QRect::top((QRect *)0x334889);
      QRect::bottom((QRect *)0x33489a);
    }
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (int)((ulong)this_00 >> 0x20),(int)this_00,in_stack_fffffffffffffedc,
                 in_stack_fffffffffffffed8);
    QGridBox::setGeometry
              (this_00,(QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_fffffffffffffee0 = this_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutPrivate::distribute(QRect r, int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);
    bool visualHReversed = hReversed;
    QWidget *parent = q->parentWidget();
    if (parent && parent->isRightToLeft())
        visualHReversed = !visualHReversed;

    setupLayoutData(hSpacing, vSpacing);

    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    r.adjust(+left, +top, -right, -bottom);

    qGeomCalc(colData, 0, cc, r.x(), r.width());
    QList<QLayoutStruct> *rDataPtr;
    if (has_hfw) {
        recalcHFW(r.width());
        qGeomCalc(*hfwData, 0, rr, r.y(), r.height());
        rDataPtr = hfwData;
    } else {
        qGeomCalc(rowData, 0, rr, r.y(), r.height());
        rDataPtr = &rowData;
    }
    QList<QLayoutStruct> &rData = *rDataPtr;
    int i;

    bool reverse = ((r.bottom() > rect.bottom()) || (r.bottom() == rect.bottom()
                                                     && ((r.right() > rect.right()) != visualHReversed)));
    int n = things.size();
    for (i = 0; i < n; ++i) {
        QGridBox *box = things.at(reverse ? n-i-1 : i);
        int r2 = box->toRow(rr);
        int c2 = box->toCol(cc);

        int x = colData.at(box->col).pos;
        int y = rData.at(box->row).pos;
        int x2p = colData.at(c2).pos + colData.at(c2).size; // x2+1
        int y2p = rData.at(r2).pos + rData.at(r2).size;    // y2+1
        int w = x2p - x;
        int h = y2p - y;

        if (visualHReversed)
            x = r.left() + r.right() - x - w + 1;
        if (vReversed)
            y = r.top() + r.bottom() - y - h + 1;

        box->setGeometry(QRect(x, y, w, h));
    }
}